

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.c
# Opt level: O0

char * blogc_render(bc_slist_t *tmpl,bc_slist_t *sources,bc_slist_t *listing_entries,
                   bc_trie_t *config,_Bool listing)

{
  bc_trie_node_t *pbVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  bc_string_t *str_00;
  size_t sVar8;
  char *pcVar9;
  bc_trie_t *local_148;
  bc_trie_t *local_130;
  bc_trie_t *local_108;
  bc_trie_t *local_f0;
  char *local_d8;
  char *local_d0;
  char *local_c0;
  char *defined2;
  bc_trie_t *listing_entry;
  blogc_template_node_t *node;
  bc_slist_t *current_listing_entry;
  bc_slist_t *tmp;
  int cmp;
  _Bool valid_else;
  _Bool evaluate;
  _Bool inside_block;
  _Bool if_not;
  bc_slist_t *foreach_start;
  bc_slist_t *foreach_var_start;
  bc_slist_t *foreach_var;
  char *foreach_name;
  size_t if_count;
  char *defined;
  char *config_value;
  bc_trie_t *tmp_source;
  bc_string_t *str;
  bc_slist_t *listing_start;
  bc_slist_t *current_source;
  _Bool listing_local;
  bc_trie_t *config_local;
  bc_slist_t *listing_entries_local;
  bc_slist_t *sources_local;
  bc_slist_t *tmpl_local;
  
  if (tmpl == (bc_slist_t *)0x0) {
    return (char *)0x0;
  }
  listing_start = (bc_slist_t *)0x0;
  str = (bc_string_t *)0x0;
  str_00 = bc_string_new();
  config_value = (char *)0x0;
  foreach_name = (char *)0x0;
  foreach_var = (bc_slist_t *)0x0;
  foreach_var_start = (bc_slist_t *)0x0;
  foreach_start = (bc_slist_t *)0x0;
  _cmp = (bc_slist_t *)0x0;
  bVar3 = false;
  bVar6 = false;
  node = (blogc_template_node_t *)listing_entries;
  current_listing_entry = tmpl;
LAB_00103a9f:
  bVar4 = false;
  if (current_listing_entry == (bc_slist_t *)0x0) {
    pcVar9 = bc_string_free(str_00,false);
    return pcVar9;
  }
  listing_entry = (bc_trie_t *)current_listing_entry->data;
  switch(*(undefined4 *)&listing_entry->root) {
  case 1:
  case 3:
    goto switchD_00103af1_caseD_1;
  case 2:
    bVar4 = true;
switchD_00103af1_caseD_1:
    foreach_name = (char *)0x0;
    if_count = 0;
    if (listing_entry->free_func != (bc_free_func_t)0x0) {
      if (bVar3) {
        local_108 = (bc_trie_t *)config_value;
      }
      else {
        local_108 = (bc_trie_t *)0x0;
      }
      if_count = (size_t)blogc_format_variable
                                   ((char *)listing_entry->free_func,config,local_108,
                                    (char *)foreach_var,foreach_var_start);
    }
    bVar5 = false;
    if (*(int *)((long)&listing_entry->root + 4) == 0) {
      if ((bVar4) && (if_count == 0)) {
        bVar5 = true;
      }
      if ((!bVar4) && (if_count != 0)) {
        bVar5 = true;
      }
    }
    else {
      local_c0 = (char *)0x0;
      if (listing_entry[1].root != (bc_trie_node_t *)0x0) {
        sVar8 = strlen(&(listing_entry[1].root)->key);
        if (((sVar8 < 2) || ((listing_entry[1].root)->key != '\"')) ||
           (pbVar1 = listing_entry[1].root, sVar8 = strlen(&(listing_entry[1].root)->key),
           *(char *)((long)pbVar1 + (sVar8 - 1)) != '\"')) {
          if (bVar3) {
            local_130 = (bc_trie_t *)config_value;
          }
          else {
            local_130 = (bc_trie_t *)0x0;
          }
          local_c0 = blogc_format_variable
                               (&(listing_entry[1].root)->key,config,local_130,(char *)foreach_var,
                                foreach_var_start);
        }
        else {
          pbVar1 = listing_entry[1].root;
          sVar8 = strlen(&(listing_entry[1].root)->key);
          local_c0 = bc_strndup(&pbVar1->field_0x1,sVar8 - 2);
        }
      }
      if ((if_count != 0) && (local_c0 != (char *)0x0)) {
        iVar7 = strcmp((char *)if_count,local_c0);
        if ((iVar7 == 0) || (((ulong)listing_entry->root & 0x100000000) == 0)) {
          if ((iVar7 == 0) && (((ulong)listing_entry->root & 0x200000000) != 0)) {
            bVar5 = true;
          }
          else if ((iVar7 < 0) && (((ulong)listing_entry->root & 0x400000000) != 0)) {
            bVar5 = true;
          }
          else if ((0 < iVar7) && (((ulong)listing_entry->root & 0x800000000) != 0)) {
            bVar5 = true;
          }
        }
        else {
          bVar5 = true;
        }
      }
      free(local_c0);
    }
    if (bVar5) {
      bVar6 = false;
    }
    else {
      while( true ) {
        while( true ) {
          current_listing_entry = current_listing_entry->next;
          piVar2 = (int *)current_listing_entry->data;
          if (((*piVar2 != 3) && (*piVar2 != 1)) && (*piVar2 != 2)) break;
          foreach_name = foreach_name + 1;
        }
        if ((*piVar2 == 4) && (foreach_name == (char *)0x0)) break;
        if (*piVar2 == 5) {
          if (foreach_name == (char *)0x0) goto LAB_00104298;
          foreach_name = foreach_name + -1;
        }
      }
      bVar6 = true;
    }
LAB_00104298:
    free((void *)if_count);
    break;
  case 4:
    foreach_name = (char *)0x0;
    if (!bVar6) {
      while( true ) {
        do {
          while( true ) {
            current_listing_entry = current_listing_entry->next;
            piVar2 = (int *)current_listing_entry->data;
            if (((*piVar2 != 3) && (*piVar2 != 1)) && (*piVar2 != 2)) break;
            foreach_name = foreach_name + 1;
          }
        } while (*piVar2 != 5);
        if (foreach_name == (char *)0x0) break;
        foreach_name = foreach_name + -1;
      }
    }
    bVar6 = false;
    break;
  case 5:
    bVar6 = false;
    if (foreach_name != (char *)0x0) {
      foreach_name = foreach_name + -1;
    }
    break;
  case 6:
    if (foreach_start == (bc_slist_t *)0x0) {
      if (listing_entry->free_func != (bc_free_func_t)0x0) {
        if (bVar3) {
          local_148 = (bc_trie_t *)config_value;
        }
        else {
          local_148 = (bc_trie_t *)0x0;
        }
        foreach_start = blogc_split_list_variable((char *)listing_entry->free_func,config,local_148)
        ;
      }
      if (foreach_start == (bc_slist_t *)0x0) {
        while (*(int *)&listing_entry->root != 7) {
          current_listing_entry = current_listing_entry->next;
          listing_entry = (bc_trie_t *)current_listing_entry->data;
        }
        break;
      }
      foreach_var = (bc_slist_t *)bc_strdup((char *)listing_entry->free_func);
      foreach_var_start = foreach_start;
      _cmp = current_listing_entry;
    }
    if (foreach_var_start == (bc_slist_t *)0x0) {
      _cmp = current_listing_entry;
      foreach_var = (bc_slist_t *)bc_strdup((char *)listing_entry->free_func);
      foreach_var_start = foreach_start;
    }
    break;
  case 7:
    if (((_cmp != (bc_slist_t *)0x0) && (foreach_var_start != (bc_slist_t *)0x0)) &&
       (foreach_var_start = foreach_var_start->next, foreach_var_start != (_bc_slist_t *)0x0)) {
      current_listing_entry = _cmp;
      goto LAB_00103a9f;
    }
    _cmp = (bc_slist_t *)0x0;
    bc_slist_free_full(foreach_start,free);
    foreach_start = (bc_slist_t *)0x0;
    free(foreach_var);
    foreach_var = (bc_slist_t *)0x0;
    break;
  case 8:
    bVar3 = true;
    foreach_name = (char *)0x0;
    iVar7 = strcmp("entry",(char *)listing_entry->free_func);
    if (iVar7 == 0) {
      if (listing) {
        while (*(int *)&listing_entry->root != 9) {
          current_listing_entry = current_listing_entry->next;
          listing_entry = (bc_trie_t *)current_listing_entry->data;
        }
        break;
      }
      if (sources == (bc_slist_t *)0x0) {
        local_d0 = (char *)0x0;
      }
      else {
        local_d0 = (char *)sources->data;
      }
      config_value = local_d0;
      listing_start = sources;
    }
    iVar7 = strcmp("listing_entry",(char *)listing_entry->free_func);
    if (iVar7 == 0) {
      defined2 = (char *)0x0;
      if (node != (blogc_template_node_t *)0x0) {
        defined2 = node->data[0];
        node = *(blogc_template_node_t **)node;
      }
      if ((defined2 == (char *)0x0) || (!listing)) {
        while (*(int *)&listing_entry->root != 9) {
          current_listing_entry = current_listing_entry->next;
          listing_entry = (bc_trie_t *)current_listing_entry->data;
        }
      }
      else {
        listing_start = (bc_slist_t *)0x0;
        config_value = defined2;
LAB_00103d16:
        iVar7 = strcmp("listing_empty",(char *)listing_entry->free_func);
        if ((iVar7 == 0) && (sources != (bc_slist_t *)0x0)) {
          while (*(int *)&listing_entry->root != 9) {
            current_listing_entry = current_listing_entry->next;
            listing_entry = (bc_trie_t *)current_listing_entry->data;
          }
        }
        else {
          iVar7 = strcmp("listing",(char *)listing_entry->free_func);
          if (iVar7 == 0) {
            if (sources == (bc_slist_t *)0x0) {
              while (*(int *)&listing_entry->root != 9) {
                current_listing_entry = current_listing_entry->next;
                listing_entry = (bc_trie_t *)current_listing_entry->data;
              }
            }
            else {
              if (listing_start == (bc_slist_t *)0x0) {
                str = (bc_string_t *)current_listing_entry;
                listing_start = sources;
              }
              if (listing_start == (bc_slist_t *)0x0) {
                local_d8 = (char *)0x0;
              }
              else {
                local_d8 = (char *)listing_start->data;
              }
              config_value = local_d8;
            }
          }
        }
      }
    }
    else {
      iVar7 = strcmp("listing",(char *)listing_entry->free_func);
      if ((((iVar7 != 0) &&
           (iVar7 = strcmp("listing_empty",(char *)listing_entry->free_func), iVar7 != 0)) &&
          (iVar7 = strcmp("listing_once",(char *)listing_entry->free_func), iVar7 != 0)) ||
         (listing)) goto LAB_00103d16;
      while (*(int *)&listing_entry->root != 9) {
        current_listing_entry = current_listing_entry->next;
        listing_entry = (bc_trie_t *)current_listing_entry->data;
      }
    }
    break;
  case 9:
    bVar3 = false;
    if ((str == (bc_string_t *)0x0) || (listing_start == (bc_slist_t *)0x0)) break;
    listing_start = listing_start->next;
    if (listing_start == (_bc_slist_t *)0x0) {
      str = (bc_string_t *)0x0;
      break;
    }
    current_listing_entry = (bc_slist_t *)str;
    goto LAB_00103a9f;
  case 10:
    if (listing_entry->free_func != (bc_free_func_t)0x0) {
      if (bVar3) {
        local_f0 = (bc_trie_t *)config_value;
      }
      else {
        local_f0 = (bc_trie_t *)0x0;
      }
      pcVar9 = blogc_format_variable
                         ((char *)listing_entry->free_func,config,local_f0,(char *)foreach_var,
                          foreach_var_start);
      if (pcVar9 != (char *)0x0) {
        bc_string_append(str_00,pcVar9);
        free(pcVar9);
      }
    }
    break;
  case 0xb:
    if (listing_entry->free_func != (bc_free_func_t)0x0) {
      bc_string_append(str_00,(char *)listing_entry->free_func);
    }
  }
  current_listing_entry = current_listing_entry->next;
  goto LAB_00103a9f;
}

Assistant:

char*
blogc_render(bc_slist_t *tmpl, bc_slist_t *sources, bc_slist_t *listing_entries,
    bc_trie_t *config, bool listing)
{
    if (tmpl == NULL)
        return NULL;

    bc_slist_t *current_source = NULL;
    bc_slist_t *listing_start = NULL;

    bc_string_t *str = bc_string_new();

    bc_trie_t *tmp_source = NULL;
    char *config_value = NULL;
    char *defined = NULL;

    size_t if_count = 0;

    char *foreach_name = NULL;
    bc_slist_t *foreach_var = NULL;
    bc_slist_t *foreach_var_start = NULL;
    bc_slist_t *foreach_start = NULL;

    bool if_not = false;
    bool inside_block = false;
    bool evaluate = false;
    bool valid_else = false;

    int cmp = 0;

    bc_slist_t *tmp = tmpl;
    bc_slist_t *current_listing_entry = listing_entries;
    while (tmp != NULL) {
        blogc_template_node_t *node = tmp->data;

        switch (node->type) {

            case BLOGC_TEMPLATE_NODE_CONTENT:
                if (node->data[0] != NULL)
                    bc_string_append(str, node->data[0]);
                break;

            case BLOGC_TEMPLATE_NODE_BLOCK:
                inside_block = true;
                if_count = 0;
                if (0 == strcmp("entry", node->data[0])) {
                    if (listing) {

                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                    current_source = sources;
                    tmp_source = current_source != NULL ? current_source->data : NULL;
                }
                if (0 == strcmp("listing_entry", node->data[0])) {
                    bc_trie_t *listing_entry = NULL;
                    if (current_listing_entry != NULL) {
                        listing_entry = current_listing_entry->data;
                        current_listing_entry = current_listing_entry->next;
                    }
                    if (listing_entry == NULL || !listing) {
                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                    current_source = NULL;
                    tmp_source = listing_entry;
                }
                else if ((0 == strcmp("listing", node->data[0])) ||
                         (0 == strcmp("listing_empty", node->data[0])) ||
                         (0 == strcmp("listing_once", node->data[0]))) {
                    if (!listing) {

                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                }
                if (0 == strcmp("listing_empty", node->data[0])) {
                    if (sources != NULL) {

                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                }
                if (0 == strcmp("listing", node->data[0])) {
                    if (sources == NULL) {

                        // we can just skip anything and walk until the next
                        // 'endblock'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDBLOCK) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                    if (current_source == NULL) {
                        listing_start = tmp;
                        current_source = sources;
                    }
                    tmp_source = current_source != NULL ? current_source->data : NULL;
                }
                break;

            case BLOGC_TEMPLATE_NODE_VARIABLE:
                if (node->data[0] != NULL) {
                    config_value = blogc_format_variable(node->data[0],
                        config, inside_block ? tmp_source : NULL, foreach_name, foreach_var);
                    if (config_value != NULL) {
                        bc_string_append(str, config_value);
                        free(config_value);
                        config_value = NULL;
                        break;
                    }
                }
                break;

            case BLOGC_TEMPLATE_NODE_ENDBLOCK:
                inside_block = false;
                if (listing_start != NULL && current_source != NULL) {
                    current_source = current_source->next;
                    if (current_source != NULL) {
                        tmp = listing_start;
                        continue;
                    }
                    else
                        listing_start = NULL;
                }
                break;

            case BLOGC_TEMPLATE_NODE_IFNDEF:
                if_not = true;

            case BLOGC_TEMPLATE_NODE_IF:
            case BLOGC_TEMPLATE_NODE_IFDEF:
                if_count = 0;
                defined = NULL;
                if (node->data[0] != NULL)
                    defined = blogc_format_variable(node->data[0], config,
                        inside_block ? tmp_source : NULL, foreach_name, foreach_var);
                evaluate = false;
                if (node->op != 0) {
                    // Strings that start with a '"' are actually strings, the
                    // others are meant to be looked up as a second variable
                    // check.
                    char *defined2 = NULL;
                    if (node->data[1] != NULL) {
                        if ((strlen(node->data[1]) >= 2) &&
                            (node->data[1][0] == '"') &&
                            (node->data[1][strlen(node->data[1]) - 1] == '"'))
                        {
                            defined2 = bc_strndup(node->data[1] + 1,
                                strlen(node->data[1]) - 2);
                        }
                        else {
                            defined2 = blogc_format_variable(node->data[1],
                                config, inside_block ? tmp_source : NULL,
                                foreach_name, foreach_var);
                        }
                    }

                    if (defined != NULL && defined2 != NULL) {
                        cmp = strcmp(defined, defined2);
                        if (cmp != 0 && node->op & BLOGC_TEMPLATE_OP_NEQ)
                            evaluate = true;
                        else if (cmp == 0 && node->op & BLOGC_TEMPLATE_OP_EQ)
                            evaluate = true;
                        else if (cmp < 0 && node->op & BLOGC_TEMPLATE_OP_LT)
                            evaluate = true;
                        else if (cmp > 0 && node->op & BLOGC_TEMPLATE_OP_GT)
                            evaluate = true;
                    }

                    free(defined2);
                }
                else {
                    if (if_not && defined == NULL)
                        evaluate = true;
                    if (!if_not && defined != NULL)
                        evaluate = true;
                }
                if (!evaluate) {

                    // at this point we can just skip anything, counting the
                    // number of 'if's, to know how many 'endif's we need to
                    // skip as well.
                    while (1) {
                        tmp = tmp->next;
                        node = tmp->data;
                        if ((node->type == BLOGC_TEMPLATE_NODE_IF) ||
                            (node->type == BLOGC_TEMPLATE_NODE_IFDEF) ||
                            (node->type == BLOGC_TEMPLATE_NODE_IFNDEF))
                        {
                            if_count++;
                            continue;
                        }
                        if ((node->type == BLOGC_TEMPLATE_NODE_ELSE) &&
                            (if_count == 0))
                        {
                            // this is somewhat complex. only an else statement
                            // right after a non evaluated block should be considered
                            // valid, because all the inner conditionals were just
                            // skipped, and all the outter conditionals evaluated
                            // to true.
                            valid_else = true;
                            break;
                        }
                        if (node->type == BLOGC_TEMPLATE_NODE_ENDIF) {
                            if (if_count > 0) {
                                if_count--;
                                continue;
                            }
                            break;
                        }
                    }
                }
                else {
                    valid_else = false;
                }
                free(defined);
                defined = NULL;
                if_not = false;
                break;

            case BLOGC_TEMPLATE_NODE_ELSE:
                if_count = 0;
                if (!valid_else) {

                    // at this point we can just skip anything, counting the
                    // number of 'if's, to know how many 'endif's we need to
                    // skip as well.
                    while (1) {
                        tmp = tmp->next;
                        node = tmp->data;
                        if ((node->type == BLOGC_TEMPLATE_NODE_IF) ||
                            (node->type == BLOGC_TEMPLATE_NODE_IFDEF) ||
                            (node->type == BLOGC_TEMPLATE_NODE_IFNDEF))
                        {
                            if_count++;
                            continue;
                        }
                        // no need to handle else statements here, because every
                        // if should have an endif.
                        if (node->type == BLOGC_TEMPLATE_NODE_ENDIF) {
                            if (if_count > 0) {
                                if_count--;
                                continue;
                            }
                            break;
                        }
                    }
                }
                valid_else = false;
                break;

            case BLOGC_TEMPLATE_NODE_ENDIF:
                // any endif statement should invalidate valid_else, to avoid
                // propagation to outter conditionals.
                valid_else = false;
                if (if_count > 0)
                    if_count--;
                break;

            case BLOGC_TEMPLATE_NODE_FOREACH:
                if (foreach_var_start == NULL) {
                    if (node->data[0] != NULL)
                        foreach_var_start = blogc_split_list_variable(node->data[0],
                            config, inside_block ? tmp_source : NULL);

                    if (foreach_var_start != NULL) {
                        foreach_name = bc_strdup(node->data[0]);
                        foreach_var = foreach_var_start;
                        foreach_start = tmp;
                    }
                    else {

                        // we can just skip anything and walk until the next
                        // 'endforeach'
                        while (node->type != BLOGC_TEMPLATE_NODE_ENDFOREACH) {
                            tmp = tmp->next;
                            node = tmp->data;
                        }
                        break;
                    }
                }

                if (foreach_var == NULL) {
                    foreach_start = tmp;
                    foreach_name = bc_strdup(node->data[0]);
                    foreach_var = foreach_var_start;
                }
                break;

            case BLOGC_TEMPLATE_NODE_ENDFOREACH:
                if (foreach_start != NULL && foreach_var != NULL) {
                    foreach_var = foreach_var->next;
                    if (foreach_var != NULL) {
                        tmp = foreach_start;
                        continue;
                    }
                }
                foreach_start = NULL;
                bc_slist_free_full(foreach_var_start, free);
                foreach_var_start = NULL;
                free(foreach_name);
                foreach_name = NULL;
                break;
        }
        tmp = tmp->next;
    }

    // no need to free temporary variables here. the template parser makes sure
    // that templates are sane and statements are closed.

    return bc_string_free(str, false);
}